

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix_command.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  pointer piVar2;
  Option *pOVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *com;
  pointer pbVar5;
  pointer piVar6;
  allocator local_449;
  vector<int,_std::allocator<int>_> vals;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  more_comms;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  App app;
  
  std::__cxx11::string::string((string *)&local_3b0,"Prefix command app",(allocator *)&vals);
  std::__cxx11::string::string((string *)&local_3d0,"",(allocator *)&more_comms);
  CLI::App::App(&app,&local_3b0,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3b0);
  app.prefix_command_ = true;
  vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_3f0,"--vals,-v",(allocator *)&more_comms);
  std::__cxx11::string::string((string *)&local_410,"",&local_449);
  pOVar3 = CLI::App::
           add_option<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_(CLI::detail::enabler)0>
                     (&app,&local_3f0,&vals,&local_410);
  pOVar3->expected_min_ = 1;
  if (pOVar3->expected_max_ < 1) {
    pOVar3->expected_max_ = 1;
  }
  pOVar3->allow_extra_args_ = true;
  pOVar3->flag_like_ = false;
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_3f0);
  CLI::App::parse_char_t<char>(&app,argc,argv);
  CLI::App::remaining_abi_cxx11_(&more_comms,&app,false);
  std::operator<<((ostream *)&std::cout,"Prefix");
  piVar2 = vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar6 = vals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start; piVar6 != piVar2; piVar6 = piVar6 + 1) {
    iVar1 = *piVar6;
    poVar4 = std::operator<<((ostream *)&std::cout,": ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar1);
    std::operator<<(poVar4," ");
  }
  poVar4 = std::operator<<((ostream *)&std::cout,'\n');
  std::operator<<(poVar4,"Remaining commands: ");
  for (pbVar5 = more_comms.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar5 != more_comms.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
    std::operator<<(poVar4," ");
  }
  std::operator<<((ostream *)&std::cout,'\n');
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&more_comms);
  CLI::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&vals.super__Vector_base<int,_std::allocator<int>_>);
  CLI::App::~App(&app);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("Prefix command app");
    app.prefix_command();

    std::vector<int> vals;
    app.add_option("--vals,-v", vals)->expected(-1);

    CLI11_PARSE(app, argc, argv);

    std::vector<std::string> more_comms = app.remaining();

    std::cout << "Prefix";
    for(int v : vals)
        std::cout << ": " << v << " ";

    std::cout << '\n' << "Remaining commands: ";

    for(const auto &com : more_comms)
        std::cout << com << " ";
    std::cout << '\n';

    return 0;
}